

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseNonIdentifyingStringOrIndex1
          (CFIReaderImpl *this,
          vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
          *valueTable)

{
  byte bVar1;
  pointer psVar2;
  size_t sVar3;
  DeadlyImportError *this_00;
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined1 *puVar5;
  shared_ptr<const_Assimp::FIValue> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  psVar2 = (valueTable->
           super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  bVar1 = *(byte *)&(psVar2->super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
  if (bVar1 == 0xff) {
    (valueTable->
    super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(psVar2->
                          super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
    puVar5 = EmptyFIString;
  }
  else {
    if (-1 < (char)bVar1) {
      sVar6 = parseEncodedCharacterString3(this);
      _Var4 = sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (0x3f < bVar1) {
        std::
        vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
        ::push_back(in_RDX,(value_type *)this);
        _Var4._M_pi = extraout_RDX;
      }
      goto LAB_00537c51;
    }
    sVar3 = parseInt2((CFIReaderImpl *)valueTable);
    psVar2 = (in_RDX->
             super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(in_RDX->
                      super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= sVar3) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar5 = (undefined1 *)(psVar2 + sVar3);
  }
  std::__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2> *)puVar5);
  _Var4._M_pi = extraout_RDX_00;
LAB_00537c51:
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseNonIdentifyingStringOrIndex1(std::vector<std::shared_ptr<const FIValue>> &valueTable) { // C.14
        uint8_t b = *dataP;
        if (b == 0xff) { // C.26.2
            // empty string
            ++dataP;
            return EmptyFIString;
        }
        else if (b & 0x80) { // C.14.4
            // We have an index
            size_t index = parseInt2();
            if (index >= valueTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return valueTable[index];
        }
        else { // C.14.3
            // We have a literal
            std::shared_ptr<const FIValue> result = parseEncodedCharacterString3();
            if (b & 0x40) { // C.14.3.1
                valueTable.push_back(result);
            }
            return result;
        }
    }